

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O3

char * cutToWhiteSpace(char *s,uint offset,char *sbuf)

{
  char *pcVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  if (s == (char *)0x0) {
    *sbuf = '\0';
    return (char *)0x0;
  }
  uVar6 = (ulong)offset;
  sVar3 = strlen(s);
  if (sVar3 <= uVar6) {
    strcpy(sbuf,s);
    sbuf[uVar6] = '\0';
    return (char *)0x0;
  }
  uVar4 = 0;
  if (offset == 0) {
LAB_00132498:
    uVar2 = (uint)uVar4;
    if (uVar2 != offset) {
      uVar6 = (ulong)(uVar2 + 1);
      goto LAB_001324cc;
    }
  }
  else {
    do {
      if (s[uVar4] == '\n') goto LAB_00132498;
      uVar4 = uVar4 + 1;
    } while (uVar6 != uVar4);
  }
  uVar4 = uVar6;
  if (offset == 0) {
    uVar2 = 0;
    uVar6 = 0;
  }
  else {
    do {
      uVar5 = (uint)uVar4;
      pcVar1 = s + uVar4;
      uVar2 = uVar5;
      if (*pcVar1 == ' ') goto LAB_001324c4;
      uVar4 = (ulong)(uVar5 - 1);
    } while (uVar5 - 1 != 0);
    uVar5 = 0;
    uVar2 = offset;
LAB_001324c4:
    if (*pcVar1 == ' ') {
      uVar6 = (ulong)(uVar5 + 1);
    }
  }
LAB_001324cc:
  strncpy(sbuf,s,(ulong)uVar2);
  sbuf[uVar2] = '\0';
  return s + uVar6;
}

Assistant:

static const char *cutToWhiteSpace(const char *s, /**< starting point of desired string to output */
                                   uint offset,   /**< column width desired */
                                   char *sbuf     /**< the buffer to output */
                                   )
{
    if (!s)
    {
        sbuf[0] = '\0';
        return NULL;
    }
    else if (strlen(s) <= offset)
    {
        strcpy(sbuf,s);
        sbuf[offset] = '\0';
        return NULL;
    }
    else
    {
        uint j, l, n;
        /* scan forward looking for newline */
        j = 0;
        while(j < offset && s[j] != '\n')
            ++j;
        if ( j == offset ) {
            /* scan backward looking for first space */
            j = offset;
            while(j && s[j] != ' ')
                --j;
            l = j;
            n = j+1;
            /* no white space */
            if (j==0)
            {
                l = offset;
                n = offset;
            }
        } else
        {
            l = j;
            n = j+1;
        }
        strncpy(sbuf,s,l);
        sbuf[l] = '\0';
        return s+n;
    }
}